

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardsDriver.cpp
# Opt level: O3

int main(void)

{
  CardType *__args;
  ostream *poVar1;
  long *plVar2;
  pointer pCVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  Hand hand;
  Deck deck;
  Hand local_80;
  vector<CardType,_std::allocator<CardType>_> local_78;
  Deck local_60;
  vector<CardType,_std::allocator<CardType>_> local_48;
  
  Deck::Deck(&local_60,9);
  Deck::createDeck(&local_60);
  uVar8 = *local_60.deckSize;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n--------------------\n Creation of a Deck \n--------------------",0x3f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if ((int)uVar8 < 1) {
    iVar6 = 0;
    iVar7 = 0;
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    iVar7 = 0;
    iVar6 = 0;
    do {
      pCVar3 = ((local_60.deckPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)((local_60.deckPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      if (uVar5 <= uVar9) {
LAB_00102dd0:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                  );
        goto LAB_00102de1;
      }
      if (pCVar3[uVar9] == INFANTRY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [INFANTRY]",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        uVar10 = (ulong)((int)uVar10 + 1);
        pCVar3 = ((local_60.deckPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)((local_60.deckPointer)->
                      super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      }
      if (uVar5 <= uVar9) goto LAB_00102dd0;
      if (pCVar3[uVar9] == ARTILLERY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [ARTILLERY]",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        iVar7 = iVar7 + 1;
        pCVar3 = ((local_60.deckPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)((local_60.deckPointer)->
                      super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      }
      if (uVar5 <= uVar9) goto LAB_00102dd0;
      if (pCVar3[uVar9] == CAVALRY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [CAVALRY]",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        iVar6 = iVar6 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n------------------\n Deck Composition \n------------------",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of [INFANTRY] cards: [",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of [ARTILLERY] cards: [",0x1e);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of [CAVALRY] cards: [",0x1c);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n---------------\n Hand of Cards \n---------------",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  Hand::Hand(&local_80);
  Deck::draw(&local_60,&local_80);
  Deck::draw(&local_60,&local_80);
  Deck::draw(&local_60,&local_80);
  uVar8 = (uint)((ulong)((long)((local_80.handPointer)->
                               super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)((local_80.handPointer)->
                              super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar8) {
    uVar10 = 0;
    do {
      pCVar3 = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      if (uVar9 <= uVar10) goto LAB_00102de1;
      if (pCVar3[uVar10] == INFANTRY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [INFANTRY]",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        pCVar3 = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)((local_80.handPointer)->
                      super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      }
      if (uVar9 <= uVar10) goto LAB_00102de1;
      if (pCVar3[uVar10] == ARTILLERY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [ARTILLERY]",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        pCVar3 = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)((local_80.handPointer)->
                      super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      }
      if (uVar9 <= uVar10) goto LAB_00102de1;
      if (pCVar3[uVar10] == CAVALRY) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Card: [CAVALRY]",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
      uVar10 = uVar10 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n\n-------------------\n Exchange Function \n-------------------",0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_finish = (CardType *)0x0;
  local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (CardType *)0x0;
  __args = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish != __args) {
    std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
              ((vector<CardType,std::allocator<CardType>> *)&local_78,(iterator)0x0,__args);
    pCVar3 = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>)
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
    if (uVar10 < 2) {
      uVar4 = 1;
    }
    else {
      if (local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
                  ((vector<CardType,std::allocator<CardType>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                   super__Vector_impl_data._M_finish,pCVar3 + 1);
        pCVar3 = ((local_80.handPointer)->super__Vector_base<CardType,_std::allocator<CardType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
         super__Vector_impl_data._M_finish = pCVar3[1];
        local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar10 = (long)((local_80.handPointer)->
                     super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
      if (2 < uVar10) {
        if (local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
                    ((vector<CardType,std::allocator<CardType>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                     super__Vector_impl_data._M_finish,pCVar3 + 2);
        }
        else {
          *local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
           super__Vector_impl_data._M_finish = pCVar3[2];
          local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::vector<CardType,_std::allocator<CardType>_>::vector(&local_48,&local_78);
        iVar6 = Hand::exchange(&local_80,&local_60,&local_48);
        if (local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar6 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Invalid set of cards exchanged. They must either: All be of the same type or all be different."
                     ,0x5e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nCards attempted to exchange:",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
          uVar10 = 0;
          do {
            pCVar3 = ((local_80.handPointer)->
                     super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = (long)((local_80.handPointer)->
                          super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            if (uVar9 <= uVar10) goto LAB_00102e03;
            if (pCVar3[uVar10] == INFANTRY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [INFANTRY]",0x10);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
              pCVar3 = ((local_80.handPointer)->
                       super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = (long)((local_80.handPointer)->
                            super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            }
            if (uVar9 <= uVar10) goto LAB_00102e03;
            if (pCVar3[uVar10] == ARTILLERY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [ARTILLERY]",0x11);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
              pCVar3 = ((local_80.handPointer)->
                       super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = (long)((local_80.handPointer)->
                            super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            }
            if (uVar9 <= uVar10) goto LAB_00102e03;
            if (pCVar3[uVar10] == CAVALRY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [CAVALRY]",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Number of armies received: ",0x1b);
          plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
          std::ostream::put((char)plVar2);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\n\n-----------------------\n Current Hand of Cards \n-----------------------",
                   0x49);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        uVar8 = (uint)((ulong)((long)((local_80.handPointer)->
                                     super__Vector_base<CardType,_std::allocator<CardType>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)((local_80.handPointer)->
                                    super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
                                    .super__Vector_impl_data._M_start) >> 2);
        if (0 < (int)uVar8) {
          uVar10 = 0;
          do {
            pCVar3 = ((local_80.handPointer)->
                     super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = (long)((local_80.handPointer)->
                          super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            if (uVar9 <= uVar10) goto LAB_00102df2;
            if (pCVar3[uVar10] == INFANTRY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [INFANTRY]",0x10);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
              pCVar3 = ((local_80.handPointer)->
                       super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = (long)((local_80.handPointer)->
                            super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            }
            if (uVar9 <= uVar10) goto LAB_00102df2;
            if (pCVar3[uVar10] == ARTILLERY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [ARTILLERY]",0x11);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
              pCVar3 = ((local_80.handPointer)->
                       super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = (long)((local_80.handPointer)->
                            super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar3 >> 2;
            }
            if (uVar9 <= uVar10) goto LAB_00102df2;
            if (pCVar3[uVar10] == CAVALRY) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Card: [CAVALRY]",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
            }
            uVar10 = uVar10 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar10);
        }
        if (local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_78.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        Hand::~Hand(&local_80);
        Deck::~Deck(&local_60);
        return 0;
      }
      uVar4 = 2;
    }
    goto LAB_00102e26;
  }
  goto LAB_00102e14;
LAB_00102de1:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_00102df2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_00102e03:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_00102e14:
  uVar4 = 0;
  uVar10 = 0;
LAB_00102e26:
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4,uVar10);
  if (local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Hand::~Hand(&local_80);
  Deck::~Deck(&local_60);
  _Unwind_Resume(uVar4);
}

Assistant:

int main() {

    int infantryCount = 0;
    int artilleryCount = 0;
    int cavalryCount = 0;

    Deck deck = Deck(9);
    deck.createDeck();

    int size = *deck.getNumberOfCards();

    std::cout << "\n--------------------\n Creation of a Deck \n--------------------" << std::endl;

    for (int i = 0; i < size; i++) {

        if (deck.getDeck()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (deck.getDeck()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (deck.getDeck()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n------------------\n Deck Composition \n------------------" << std::endl;

    std::cout << "Number of [INFANTRY] cards: [" << infantryCount << "]" << std::endl;
    std::cout << "Number of [ARTILLERY] cards: [" << artilleryCount << "]" << std::endl;
    std::cout << "Number of [CAVALRY] cards: [" << cavalryCount << "]" << std::endl;

    std::cout << "\n\n---------------\n Hand of Cards \n---------------" << std::endl;

    Hand hand = Hand();
    deck.draw(hand);
    deck.draw(hand);
    deck.draw(hand);

    int handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }

    std::cout << "\n\n-------------------\n Exchange Function \n-------------------" << std::endl;

    std::vector<CardType> cardsExchanged = std::vector<CardType>();
    cardsExchanged.push_back(hand.getHand()->at(0));
    cardsExchanged.push_back(hand.getHand()->at(1));
    cardsExchanged.push_back(hand.getHand()->at(2));

    int armiesReceived = Hand::exchange(&hand, &deck, cardsExchanged);

    if (armiesReceived == -1) {
        std::cout << ("Invalid set of cards exchanged. They must either: All be of the same type or all be different.")
                  << std::endl;
        std::cout << ("\nCards attempted to exchange:") << std::endl;

        for (int i = 0; i < 3; i++) {
            if (hand.getHand()->at(i) == 0) {
                std::cout << "Card: [INFANTRY]" << std::endl;
                infantryCount++;
            }
            if (hand.getHand()->at(i) == 1) {
                std::cout << "Card: [ARTILLERY]" << std::endl;
                artilleryCount++;
            }
            if (hand.getHand()->at(i) == 2) {
                std::cout << "Card: [CAVALRY]" << std::endl;
                cavalryCount++;
            }
        }

    } else {
        std::cout << "Number of armies received: " << armiesReceived << std::endl;
    }

    std::cout << "\n\n-----------------------\n Current Hand of Cards \n-----------------------" << std::endl;

    handSize = hand.getHand()->size();

    for (int i = 0; i < handSize; i++) {
        if (hand.getHand()->at(i) == 0) {
            std::cout << "Card: [INFANTRY]" << std::endl;
            infantryCount++;
        }
        if (hand.getHand()->at(i) == 1) {
            std::cout << "Card: [ARTILLERY]" << std::endl;
            artilleryCount++;
        }
        if (hand.getHand()->at(i) == 2) {
            std::cout << "Card: [CAVALRY]" << std::endl;
            cavalryCount++;
        }
    }
}